

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_histogram.cpp
# Opt level: O3

void __thiscall duckdb::HistogramBinState<short>::Destroy(HistogramBinState<short> *this)

{
  unsafe_vector<short> *puVar1;
  pointer psVar2;
  unsafe_vector<idx_t> *puVar3;
  pointer puVar4;
  
  puVar1 = this->bin_boundaries;
  if (puVar1 != (unsafe_vector<short> *)0x0) {
    psVar2 = (puVar1->super_vector<short,_std::allocator<short>_>).
             super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
             _M_start;
    if (psVar2 != (pointer)0x0) {
      operator_delete(psVar2);
    }
    operator_delete(puVar1);
    this->bin_boundaries = (unsafe_vector<short> *)0x0;
  }
  puVar3 = this->counts;
  if (puVar3 != (unsafe_vector<idx_t> *)0x0) {
    puVar4 = (puVar3->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (puVar4 != (pointer)0x0) {
      operator_delete(puVar4);
    }
    operator_delete(puVar3);
    this->counts = (unsafe_vector<idx_t> *)0x0;
  }
  return;
}

Assistant:

void Destroy() {
		if (bin_boundaries) {
			delete bin_boundaries;
			bin_boundaries = nullptr;
		}
		if (counts) {
			delete counts;
			counts = nullptr;
		}
	}